

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Poly::Get_y_dx(ChFunction_Poly *this,double x)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [64];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  if (0 < this->order) {
    dVar6 = 0.0;
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      dVar2 = this->coeff[lVar4 + 1];
      auVar5._0_8_ = pow(x,(double)(int)lVar4);
      auVar5._8_56_ = extraout_var;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar6;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (double)(int)lVar1 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar7,auVar5._0_16_,auVar3);
      dVar6 = auVar3._0_8_;
      lVar4 = lVar1;
    } while (lVar1 < this->order);
    return dVar6;
  }
  return 0.0;
}

Assistant:

double ChFunction_Poly::Get_y_dx(double x) const {
    double total = 0;
    for (int i = 1; i <= order; i++) {
        total += ((double)i * coeff[i] * pow(x, ((double)(i - 1))));
    }
    return total;
}